

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

bool __thiscall
kj::ArrayPtr<unsigned_char>::operator==
          (ArrayPtr<unsigned_char> *this,ArrayPtr<unsigned_char> *other)

{
  size_t __n;
  int iVar1;
  
  __n = this->size_;
  if (__n != other->size_) {
    return false;
  }
  if (__n != 0) {
    iVar1 = bcmp(this->ptr,other->ptr,__n);
    return iVar1 == 0;
  }
  return true;
}

Assistant:

inline constexpr bool operator==(const ArrayPtr& other) const {
    if (size_ != other.size_) return false;
#if KJ_HAS_COMPILER_FEATURE(cxx_constexpr_string_builtins)
    if (isIntegral<RemoveConst<T>>()) {
      if (size_ == 0) return true;
      return __builtin_memcmp(ptr, other.ptr, size_ * sizeof(T)) == 0;
    }
#endif
    for (size_t i = 0; i < size_; i++) {
      if (ptr[i] != other[i]) return false;
    }
    return true;
  }